

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_compressionParameters *
ZSTD_getCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,int compressionLevel,
          unsigned_long_long srcSizeHint,size_t dictSize,ZSTD_cParamMode_e mode)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ZSTD_compressionParameters cPar;
  int iVar8;
  size_t sVar9;
  ZSTD_compressionParameters *pZVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ZSTD_compressionParameters cp;
  undefined8 uStack_28;
  undefined4 uStack_20;
  undefined4 local_1c;
  undefined4 uStack_18;
  undefined8 uStack_14;
  
  sVar9 = dictSize;
  if ((1 < mode - ZSTD_cpm_createCDict) && (mode != ZSTD_cpm_noAttachDict)) {
    if (mode != ZSTD_cpm_attachDict) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1b21,"U64 ZSTD_getCParamRowSize(U64, size_t, ZSTD_cParamMode_e)");
    }
    sVar9 = 0;
  }
  uVar11 = 0xffffffffffffffff;
  if (srcSizeHint != 0xffffffffffffffff || sVar9 != 0) {
    lVar12 = 500;
    if (sVar9 == 0) {
      lVar12 = 0;
    }
    lVar13 = 0;
    if (srcSizeHint == 0xffffffffffffffff) {
      lVar13 = lVar12;
    }
    uVar11 = sVar9 + srcSizeHint + lVar13;
  }
  lVar12 = (ulong)(uVar11 < 0x20001) + (ulong)(uVar11 < 0x40001) + (ulong)(uVar11 < 0x4001);
  if (compressionLevel == 0) {
    uVar11 = 3;
  }
  else {
    if (compressionLevel < 0) {
      uStack_28._0_4_ =
           ((ZSTD_compressionParameters *)((long)(ZSTD_defaultCParameters + lVar12) + 0))->windowLog
      ;
      uStack_28._4_4_ =
           ((ZSTD_compressionParameters *)((long)(ZSTD_defaultCParameters + lVar12) + 0))->chainLog;
      uVar4 = ((ZSTD_compressionParameters *)((long)(ZSTD_defaultCParameters + lVar12) + 0))->
              hashLog;
      uVar5 = ((ZSTD_compressionParameters *)((long)(ZSTD_defaultCParameters + lVar12) + 0))->
              searchLog;
      uVar6 = ((ZSTD_compressionParameters *)((long)(ZSTD_defaultCParameters + lVar12) + 0))->
              minMatch;
      uVar7 = ((ZSTD_compressionParameters *)((long)(ZSTD_defaultCParameters + lVar12) + 0))->
              strategy;
      iVar8 = -0x20000;
      if (0xfffe0000 < (uint)compressionLevel) {
        iVar8 = compressionLevel;
      }
      uStack_14 = CONCAT44(uVar7,-iVar8);
      uStack_20 = uVar4;
      local_1c = uVar5;
      uStack_18 = uVar6;
      goto LAB_007611e0;
    }
    uVar11 = 0x16;
    if ((uint)compressionLevel < 0x16) {
      uVar11 = (ulong)(uint)compressionLevel;
    }
  }
  pZVar10 = ZSTD_defaultCParameters[lVar12] + uVar11;
  uStack_28._0_4_ = pZVar10->windowLog;
  uStack_28._4_4_ = pZVar10->chainLog;
  uVar2 = pZVar10->hashLog;
  uVar3 = pZVar10->searchLog;
  puVar1 = (undefined8 *)(lVar12 * 0x284 + 0x91ee3c + uVar11 * 0x1c);
  uStack_14 = puVar1[1];
  uStack_18 = (undefined4)((ulong)*puVar1 >> 0x20);
  uStack_20 = uVar2;
  local_1c = uVar3;
LAB_007611e0:
  cPar.hashLog = uStack_20;
  cPar.windowLog = (undefined4)uStack_28;
  cPar.chainLog = uStack_28._4_4_;
  cPar.searchLog = local_1c;
  cPar.minMatch = uStack_18;
  cPar.targetLength = (undefined4)uStack_14;
  cPar.strategy = uStack_14._4_4_;
  pZVar10 = ZSTD_adjustCParams_internal
                      (__return_storage_ptr__,cPar,srcSizeHint,dictSize,mode,ZSTD_ps_auto);
  return pZVar10;
}

Assistant:

static ZSTD_compressionParameters ZSTD_getCParams_internal(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode)
{
    U64 const rSize = ZSTD_getCParamRowSize(srcSizeHint, dictSize, mode);
    U32 const tableID = (rSize <= 256 KB) + (rSize <= 128 KB) + (rSize <= 16 KB);
    int row;
    DEBUGLOG(5, "ZSTD_getCParams_internal (cLevel=%i)", compressionLevel);

    /* row */
    if (compressionLevel == 0) row = ZSTD_CLEVEL_DEFAULT;   /* 0 == default */
    else if (compressionLevel < 0) row = 0;   /* entry 0 is baseline for fast mode */
    else if (compressionLevel > ZSTD_MAX_CLEVEL) row = ZSTD_MAX_CLEVEL;
    else row = compressionLevel;

    {   ZSTD_compressionParameters cp = ZSTD_defaultCParameters[tableID][row];
        DEBUGLOG(5, "ZSTD_getCParams_internal selected tableID: %u row: %u strat: %u", tableID, row, (U32)cp.strategy);
        /* acceleration factor */
        if (compressionLevel < 0) {
            int const clampedCompressionLevel = MAX(ZSTD_minCLevel(), compressionLevel);
            cp.targetLength = (unsigned)(-clampedCompressionLevel);
        }
        /* refine parameters based on srcSize & dictSize */
        return ZSTD_adjustCParams_internal(cp, srcSizeHint, dictSize, mode, ZSTD_ps_auto);
    }
}